

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscrete::CreateNewObservationModel
          (MultiAgentDecisionProcessDiscrete *this)

{
  bool bVar1;
  bool bVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ObservationModelMappingSparse *this_00;
  
  if ((this->_m_initialized == true) && (this->_m_p_oModel != (ObservationModelDiscrete *)0x0)) {
    (*(this->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
      _vptr_ObservationModel[1])();
  }
  bVar1 = this->_m_sparse;
  bVar2 = this->_m_eventObservability;
  this_00 = (ObservationModelMappingSparse *)operator_new(0x30);
  pcVar3 = *(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x30);
  if (bVar2 == false) {
    if (bVar1 == false) {
      iVar4 = (*pcVar3)(this);
      iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd0))(this);
      ObservationModelMapping::ObservationModelMapping
                ((ObservationModelMapping *)this_00,iVar4,iVar5,iVar6);
    }
    else {
      iVar4 = (*pcVar3)(this);
      iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd0))(this);
      ObservationModelMappingSparse::ObservationModelMappingSparse(this_00,iVar4,iVar5,iVar6);
    }
  }
  else if (bVar1 == false) {
    iVar4 = (*pcVar3)(this);
    iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
    iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd0))(this);
    EventObservationModelMapping::EventObservationModelMapping
              ((EventObservationModelMapping *)this_00,iVar4,iVar5,iVar6);
  }
  else {
    iVar4 = (*pcVar3)(this);
    iVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
    iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd0))(this);
    EventObservationModelMappingSparse::EventObservationModelMappingSparse
              ((EventObservationModelMappingSparse *)this_00,iVar4,iVar5,iVar6);
  }
  this->_m_p_oModel = (ObservationModelDiscrete *)this_00;
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscrete::CreateNewObservationModel()
{
    if(_m_initialized)
        delete(_m_p_oModel);
    if(!_m_eventObservability)
    {
        if(_m_sparse)
            _m_p_oModel = new 
                ObservationModelMappingSparse(GetNrStates(), 
                                              GetNrJointActions(),
                                              GetNrJointObservations());
        else 
            _m_p_oModel = new 
                ObservationModelMapping(GetNrStates(),
                                        GetNrJointActions(), 
                                        GetNrJointObservations());
    }
    else
    {
        if(_m_sparse)
            _m_p_oModel = new 
                EventObservationModelMappingSparse(GetNrStates(), 
                                                   GetNrJointActions(),
                                                   GetNrJointObservations());
        else
            _m_p_oModel = new 
                EventObservationModelMapping(GetNrStates(), 
                                             GetNrJointActions(),
                                             GetNrJointObservations());
    }
}